

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

VkResult Fossilize::CreateComputePipelines
                   (VkDevice device,VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkComputePipelineCreateInfo *pCreateInfos,VkAllocationCallbacks *pAllocator,
                   VkPipeline *pPipelines)

{
  byte *pbVar1;
  Instance *pIVar2;
  int *piVar3;
  int *piVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  VkResult VVar8;
  LogLevel LVar9;
  VkBaseInStructure *s;
  Device *this;
  VkComputePipelineCreateInfo *pVVar10;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT p_Var11;
  int *piVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  VkPipelineCreateFlags VVar16;
  uint uVar17;
  VkPipeline pipeline;
  VkComputePipelineCreateInfo *pVVar18;
  ulong uVar19;
  uint32_t i;
  void **outpNext;
  ulong uVar20;
  byte bVar21;
  VkResult local_e4;
  VkResult local_d4;
  VkComputePipelineCreateInfo local_90;
  
  bVar21 = 0;
  this = get_device_layer(device);
  pIVar2 = this->pInstance;
  if ((pIVar2->enableCrashHandler == false) && ((pIVar2->synchronized & 1U) == 0)) {
    bVar7 = false;
    if ((createInfoCount != 0) && (pIVar2->enablePrecompileQA != false)) {
      uVar15 = 0;
      bVar7 = false;
      do {
        piVar12 = (int *)pCreateInfos[uVar15].pNext;
        for (piVar3 = piVar12; (piVar3 != (int *)0x0 && (*piVar3 != 0x3ba1f5f5));
            piVar3 = *(int **)(piVar3 + 2)) {
        }
        piVar4 = piVar12;
        if (piVar3 == (int *)0x0) {
          VVar16 = pCreateInfos[uVar15].flags;
        }
        else {
          VVar16 = (VkPipelineCreateFlags)*(undefined8 *)(piVar3 + 4);
        }
        for (; (piVar4 != (int *)0x0 && (*piVar4 != 0x3b9f36d0)); piVar4 = *(int **)(piVar4 + 2)) {
        }
        for (; (piVar12 != (int *)0x0 && (*piVar12 != 0x3ba228ba)); piVar12 = *(int **)(piVar12 + 2)
            ) {
        }
        if ((piVar12 != (int *)0x0) && (piVar12[4] != 0)) break;
        if (piVar4 == (int *)0x0) {
          uVar17 = VVar16 >> 8 & 1;
        }
        else {
          if ((VVar16 >> 10 & 1) == 0 && piVar4[4] != 0) break;
          uVar17 = VVar16 & 0x100;
        }
        if (uVar17 != 0) break;
        uVar15 = uVar15 + 1;
        bVar7 = createInfoCount <= uVar15;
      } while (uVar15 != createInfoCount);
    }
    local_d4 = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
    if (bVar7) {
      ScratchAllocator::ScratchAllocator((ScratchAllocator *)&local_90);
      uVar15 = (ulong)createInfoCount;
      if (createInfoCount == 0) {
        pVVar10 = (VkComputePipelineCreateInfo *)0x0;
      }
      else {
        pVVar10 = (VkComputePipelineCreateInfo *)
                  ScratchAllocator::allocate_raw((ScratchAllocator *)&local_90,uVar15 * 0x60,0x10);
      }
      memcpy(pVVar10,pCreateInfos,uVar15 * 0x60);
      if (createInfoCount != 0) {
        uVar19 = 0;
        do {
          outpNext = &pVVar10[uVar19].pNext;
          pbVar1 = (byte *)((long)&pVVar10[uVar19].flags + 1);
          *pbVar1 = *pbVar1 | 1;
          bVar6 = shallowCopyPnextChain((ScratchAllocator *)&local_90,*outpNext,outpNext);
          if (!bVar6) {
            local_d4 = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
            goto LAB_00115aea;
          }
          for (piVar12 = (int *)*outpNext; (piVar12 != (int *)0x0 && (*piVar12 != 0x3ba1f5f5));
              piVar12 = *(int **)(piVar12 + 2)) {
          }
          if (piVar12 != (int *)0x0) {
            *(byte *)((long)piVar12 + 0x11) = *(byte *)((long)piVar12 + 0x11) | 1;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar15);
      }
      local_d4 = (*this->pTable->CreateComputePipelines)
                           (device,(VkPipelineCache)0x0,createInfoCount,pVVar10,pAllocator,
                            pPipelines);
      if (local_d4 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        if (createInfoCount != 0) {
          uVar19 = 0;
          do {
            if (pPipelines[uVar19] == (VkPipeline)0x0) {
              for (piVar12 = (int *)pCreateInfos[uVar19].pNext;
                  (piVar12 != (int *)0x0 && (*piVar12 != 0x3ba1f5f5));
                  piVar12 = *(int **)(piVar12 + 2)) {
              }
              if (piVar12 == (int *)0x0) {
                uVar20 = (ulong)pCreateInfos[uVar19].flags;
              }
              else {
                uVar20 = *(ulong *)(piVar12 + 4);
              }
              LVar9 = get_thread_log_level();
              if ((int)LVar9 < 2) {
                bVar6 = Internal::log_thread_callback
                                  (LOG_DEFAULT,
                                   "QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                                   ,uVar20 >> 0x20,uVar20);
                if (!bVar6) {
                  fprintf(_stderr,
                          "Fossilize WARN: QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                          ,uVar20 >> 0x20,uVar20 & 0xffffffff);
                }
              }
              Device::registerPrecompileQAFailure(this,1);
              if (this->usesModuleIdentifiers == true) {
                p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
              }
              else {
                p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
              }
              bVar6 = StateRecorder::record_compute_pipeline
                                (this->recorder,pPipelines[uVar19],pCreateInfos + uVar19,pPipelines,
                                 createInfoCount,0,device,p_Var11);
              if (((!bVar6) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
                 (bVar6 = Internal::log_thread_callback
                                    (LOG_DEFAULT,
                                     "Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                                    ), !bVar6)) {
                CreateComputePipelines();
              }
            }
            else {
              Device::registerPrecompileQASuccess(this,1);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar15);
          uVar19 = 0;
          do {
            (*this->pTable->DestroyPipeline)(this->device,pPipelines[uVar19],pAllocator);
            pPipelines[uVar19] = (VkPipeline)0x0;
            uVar19 = uVar19 + 1;
          } while (uVar15 != uVar19);
        }
      }
      else {
        Device::registerPrecompileQASuccess(this,createInfoCount);
      }
LAB_00115aea:
      ScratchAllocator::~ScratchAllocator((ScratchAllocator *)&local_90);
    }
    if (local_d4 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
      local_d4 = (*this->pTable->CreateComputePipelines)
                           (device,pipelineCache,createInfoCount,pCreateInfos,pAllocator,pPipelines)
      ;
    }
    if (bVar7 || local_d4 != VK_SUCCESS) {
      return local_d4;
    }
    if (createInfoCount != 0) {
      uVar15 = 0;
      do {
        if (this->usesModuleIdentifiers == true) {
          p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar7 = StateRecorder::record_compute_pipeline
                          (this->recorder,pPipelines[uVar15],pCreateInfos,pPipelines,createInfoCount
                           ,0,device,p_Var11);
        if (((!bVar7) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
           (bVar7 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar7)) {
          CreateComputePipelines();
        }
        uVar15 = uVar15 + 1;
        pCreateInfos = pCreateInfos + 1;
      } while (createInfoCount != uVar15);
    }
  }
  else if (createInfoCount != 0) {
    memset(pPipelines,0,(ulong)createInfoCount * 8);
    uVar15 = 0;
    local_e4 = VK_SUCCESS;
    do {
      pVVar10 = pCreateInfos + uVar15;
      pVVar18 = &local_90;
      for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
        uVar5 = *(undefined4 *)&pVVar10->field_0x4;
        pVVar18->sType = pVVar10->sType;
        *(undefined4 *)&pVVar18->field_0x4 = uVar5;
        pVVar10 = (VkComputePipelineCreateInfo *)((long)pVVar10 + (ulong)bVar21 * -0x10 + 8);
        pVVar18 = (VkComputePipelineCreateInfo *)((long)pVVar18 + (ulong)bVar21 * -0x10 + 8);
      }
      if ((-1 < local_90.basePipelineIndex &
          local_90.basePipelineHandle == (VkPipeline)0x0 & (byte)local_90.flags >> 2) == 1) {
        local_90.basePipelineHandle = pPipelines[(uint)local_90.basePipelineIndex];
        local_90.basePipelineIndex = 0xffffffff;
      }
      if (this->pInstance->synchronized == true) {
        if (this->usesModuleIdentifiers == true) {
          p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar7 = StateRecorder::record_compute_pipeline
                          (this->recorder,(VkPipeline)0x0,&local_90,(VkPipeline *)0x0,0,0,device,
                           p_Var11);
        if (((!bVar7) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
           (bVar7 = Internal::log_thread_callback(LOG_DEFAULT,"Failed to capture eagerly.\n"),
           !bVar7)) {
          CreateComputePipelines();
        }
      }
      Instance::braceForComputePipelineCrash(this->recorder,&local_90);
      VVar8 = (*this->pTable->CreateComputePipelines)
                        (device,pipelineCache,1,&local_90,pAllocator,pPipelines + uVar15);
      Instance::completedPipelineCompilation();
      if (VVar8 == VK_SUCCESS) {
        pipeline = pPipelines[uVar15];
      }
      else {
        pipeline = (VkPipeline)0x0;
      }
      if (this->usesModuleIdentifiers == true) {
        p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
      }
      else {
        p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
      }
      bVar7 = StateRecorder::record_compute_pipeline
                        (this->recorder,pipeline,&local_90,(VkPipeline *)0x0,0,0,device,p_Var11);
      if (((!bVar7) && (LVar9 = get_thread_log_level(), (int)LVar9 < 2)) &&
         (bVar7 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                            ), !bVar7)) {
        CreateComputePipelines();
      }
      if (VVar8 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        local_e4 = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
      }
      if (VVar8 < VK_SUCCESS) {
        iVar13 = 1;
        local_d4 = VVar8;
        if (uVar15 == 0) {
          bVar7 = false;
        }
        else {
          uVar19 = 0;
          do {
            (*this->pTable->DestroyPipeline)(device,pPipelines[uVar19],pAllocator);
            uVar19 = uVar19 + 1;
          } while (uVar15 != uVar19);
          bVar7 = false;
          iVar13 = 1;
        }
      }
      else if ((VVar8 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) &&
              ((local_90.flags._1_1_ & 2) != 0)) {
        iVar13 = 5;
        bVar7 = false;
      }
      else {
        iVar13 = 0;
        bVar7 = true;
      }
      if (!bVar7) goto LAB_0011588a;
      uVar15 = uVar15 + 1;
    } while (uVar15 != createInfoCount);
    iVar13 = 5;
LAB_0011588a:
    if (iVar13 != 5) {
      return local_d4;
    }
    return local_e4;
  }
  return VK_SUCCESS;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateComputePipelines(VkDevice device, VkPipelineCache pipelineCache,
                                                             uint32_t createInfoCount,
                                                             const VkComputePipelineCreateInfo *pCreateInfos,
                                                             const VkAllocationCallbacks *pAllocator,
                                                             VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
		return CreateComputePipelinesParanoid(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
	else
		return CreateComputePipelinesNormal(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
}